

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# required_fields_test.cc
# Opt level: O2

void __thiscall
RequiredFieldsTest<Edition2023Type>::CheckRequired
          (RequiredFieldsTest<Edition2023Type> *this,string_view json,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missing)

{
  _Bool _Var1;
  upb_util_2023_test_TestRequiredFields *msg;
  upb_MessageDef *m;
  Message *message;
  char *pcVar2;
  AssertHelper local_298;
  AssertionResult gtest_ar_;
  upb_FieldPathEntry *entries;
  AssertionResult gtest_ar;
  AssertHelper local_258;
  DefPool defpool;
  Arena arena;
  Status status;
  
  arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl = upb_Arena_New();
  arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)>.super__Head_base<1UL,_void_(*)(upb_Arena_*),_false>.
  _M_head_impl = (_Head_base<1UL,_void_(*)(upb_Arena_*),_false>)upb_Arena_Free;
  defpool.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl = upb_DefPool_New();
  defpool.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_DefPool_*)>.
  super__Head_base<1UL,_void_(*)(upb_DefPool_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(upb_DefPool_*),_false>)upb_DefPool_Free;
  msg = upb_util_2023_test_TestRequiredFields_new
                  (arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                   super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                   super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl);
  m = upb_util_2023_test_TestRequiredFields_getmsgdef
                (defpool.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                 super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                 super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl);
  upb_Status_Clear(&status.status_);
  pcVar2 = (char *)0x0;
  gtest_ar_.success_ =
       upb_JsonDecode(json._M_str,json._M_len,&msg->base_dont_copy_me__upb_internal_use_only,m,
                      defpool.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>.
                      _M_t.super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                      super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl,0,
                      arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                      super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                      super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl,&status.status_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&entries);
    local_298.data_ = (AssertHelperData *)upb_Status_ErrorMessage(&status.status_);
    message = testing::Message::operator<<((Message *)&entries,(char **)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)
               "upb_JsonDecode(json.data(), json.size(), (&(test_msg)->base_dont_copy_me__upb_internal_use_only), m.ptr(), defpool.ptr(), 0, arena.ptr(), status.ptr())"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/required_fields_test.cc"
               ,0x3b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_258,message);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (entries != (upb_FieldPathEntry *)0x0) {
      (*(code *)entries->field->resolved_features)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  entries = (upb_FieldPathEntry *)0x0;
  gtest_ar_.success_ =
       (missing->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start !=
       (missing->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  _Var1 = upb_util_HasUnsetRequired
                    (&msg->base_dont_copy_me__upb_internal_use_only,m,
                     defpool.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>.
                     _M_t.super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                     super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl,&entries);
  local_298.data_._0_1_ = _Var1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"!missing.empty()",
             "upb_util_HasUnsetRequired((&(test_msg)->base_dont_copy_me__upb_internal_use_only), m.ptr(), defpool.ptr(), &entries)"
             ,&gtest_ar_.success_,(bool *)&local_298);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/required_fields_test.cc"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  if (entries != (upb_FieldPathEntry *)0x0) {
    PathsToText_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gtest_ar,entries);
    testing::internal::
    CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((internal *)&gtest_ar_,"missing","PathsToText(entries)",missing,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gtest_ar);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&gtest_ar);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/required_fields_test.cc"
                 ,0x42,pcVar2);
      testing::internal::AssertHelper::operator=(&local_298,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_298);
      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    free(entries);
  }
  gtest_ar_.success_ =
       (missing->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start !=
       (missing->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  _Var1 = upb_util_HasUnsetRequired
                    (&msg->base_dont_copy_me__upb_internal_use_only,m,
                     defpool.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>.
                     _M_t.super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                     super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl,
                     (upb_FieldPathEntry **)0x0);
  local_298.data_._0_1_ = _Var1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"!missing.empty()",
             "upb_util_HasUnsetRequired((&(test_msg)->base_dont_copy_me__upb_internal_use_only), m.ptr(), defpool.ptr(), nullptr)"
             ,&gtest_ar_.success_,(bool *)&local_298);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/required_fields_test.cc"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::unique_ptr<upb_DefPool,_void_(*)(upb_DefPool_*)>::~unique_ptr(&defpool.ptr_);
  std::unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)>::~unique_ptr(&arena.ptr_);
  return;
}

Assistant:

void CheckRequired(absl::string_view json,
                     const std::vector<std::string>& missing) {
    upb::Arena arena;
    upb::DefPool defpool;
    auto* test_msg = T::NewMessage(arena.ptr());
    upb::MessageDefPtr m = T::GetMessageDef(defpool.ptr());
    upb::Status status;
    EXPECT_TRUE(upb_JsonDecode(json.data(), json.size(), UPB_UPCAST(test_msg),
                               m.ptr(), defpool.ptr(), 0, arena.ptr(),
                               status.ptr()))
        << status.error_message();
    upb_FieldPathEntry* entries = nullptr;
    EXPECT_EQ(!missing.empty(),
              upb_util_HasUnsetRequired(UPB_UPCAST(test_msg), m.ptr(),
                                        defpool.ptr(), &entries));
    if (entries) {
      EXPECT_EQ(missing, PathsToText(entries));
      free(entries);
    }

    // Verify that we can pass a NULL pointer to entries when we don't care
    // about them.
    EXPECT_EQ(!missing.empty(),
              upb_util_HasUnsetRequired(UPB_UPCAST(test_msg), m.ptr(),
                                        defpool.ptr(), nullptr));
  }